

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FixBoundsPS::FixBoundsPS
          (FixBoundsPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,int j,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val,shared_ptr<soplex::Tolerances> *tols)

{
  bool bVar1;
  type_conflict5 tVar2;
  SPxInternalCodeException *this_00;
  undefined4 in_EDX;
  long *in_RDI;
  undefined4 in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffbf0;
  double in_stack_fffffffffffffbf8;
  allocator *paVar3;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  char *in_stack_fffffffffffffc08;
  undefined6 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc16;
  type_conflict5 tVar4;
  undefined1 in_stack_fffffffffffffc17;
  allocator local_379;
  string local_378 [32];
  undefined1 local_358 [40];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffcd0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffcd8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffce0;
  undefined1 local_314 [56];
  undefined1 local_2dc [56];
  undefined1 local_2a4 [56];
  undefined1 local_26c [56];
  undefined1 local_234 [56];
  undefined1 local_1fc [56];
  undefined1 local_1c4 [56];
  undefined1 local_18c [56];
  undefined1 local_154 [56];
  undefined1 local_11c [104];
  undefined4 local_b4;
  undefined8 local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined1 *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  undefined1 *local_58;
  undefined1 *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  undefined1 *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  undefined1 *local_18;
  undefined8 local_10;
  undefined1 *local_8;
  
  local_b4 = in_EDX;
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffbf0,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x434463);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x434479);
  PostStep::PostStep((PostStep *)
                     CONCAT17(in_stack_fffffffffffffc17,
                              CONCAT16(in_stack_fffffffffffffc16,in_stack_fffffffffffffc10)),
                     in_stack_fffffffffffffc08,
                     (shared_ptr<soplex::Tolerances> *)
                     CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                     (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                     SUB84(in_stack_fffffffffffffbf8,0));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4344b6);
  *in_RDI = (long)&PTR__FixBoundsPS_004f0c08;
  *(undefined4 *)(in_RDI + 5) = local_b4;
  local_70 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::lower(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
  local_68 = local_11c;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffbf0,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  local_60 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::upper(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
  local_58 = local_154;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffbf0,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  (**(code **)(*in_RDI + 0x30))(local_18c);
  bVar1 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  if (bVar1) {
    *(undefined4 *)((long)in_RDI + 0x2c) = 2;
  }
  else {
    local_48 = local_1c4;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffbf0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    local_40 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::lower(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
    local_38 = local_1fc;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffbf0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    (**(code **)(*in_RDI + 0x30))(local_234);
    bVar1 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0
                      );
    if (bVar1) {
      *(undefined4 *)((long)in_RDI + 0x2c) = 1;
    }
    else {
      local_28 = local_26c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffbf0,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      local_20 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::upper(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      local_18 = local_2a4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffbf0,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      (**(code **)(*in_RDI + 0x30))(local_2dc);
      bVar1 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                         in_stack_fffffffffffffcd0);
      if (bVar1) {
        *(undefined4 *)((long)in_RDI + 0x2c) = 0;
      }
      else {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::lower(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        infinity();
        local_90 = local_314;
        local_98 = &stack0xfffffffffffffce0;
        local_a0 = 0;
        local_8 = local_98;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                   in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
        tVar2 = boost::multiprecision::operator<=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x43486e);
        tVar4 = false;
        if (tVar2) {
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::upper(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
          local_80 = infinity();
          local_78 = local_358;
          local_88 = 0;
          local_10 = local_80;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                     in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
          tVar4 = boost::multiprecision::operator>=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x43490f);
        }
        if (tVar4 == false) {
          this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
          paVar3 = &local_379;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_378,"XMAISM14 This should never happen.",paVar3);
          SPxInternalCodeException::SPxInternalCodeException
                    (this_00,(string *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                    );
          __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,
                      SPxInternalCodeException::~SPxInternalCodeException);
        }
        *(undefined4 *)((long)in_RDI + 0x2c) = 3;
      }
    }
  }
  return;
}

Assistant:

FixBoundsPS(const SPxLPBase<R>& lp, int j, R val, std::shared_ptr<Tolerances> tols)
         : PostStep("FixBounds", tols, lp.nRows(), lp.nCols())
         , m_j(j)
      {
         if(EQrel(lp.lower(j), lp.upper(j), this->feastol()))
            m_status = SPxSolverBase<R>::FIXED;
         else if(EQrel(val, lp.lower(j), this->feastol()))
            m_status = SPxSolverBase<R>::ON_LOWER;
         else if(EQrel(val, lp.upper(j), this->feastol()))
            m_status = SPxSolverBase<R>::ON_UPPER;
         else if(lp.lower(j) <= R(-infinity) && lp.upper(j) >= R(infinity))
            m_status = SPxSolverBase<R>::ZERO;
         else
         {
            throw SPxInternalCodeException("XMAISM14 This should never happen.");
         }
      }